

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ulong uVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  float fVar34;
  undefined4 uVar35;
  float fVar44;
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  vfloat4 v_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar62;
  vfloat4 v_2;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vfloat4 v;
  float fVar63;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar108;
  uint uVar111;
  uint uVar112;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar117 [16];
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined1 local_108 [16];
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  undefined1 local_e8 [16];
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar108 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + uVar108 * sVar8);
  fVar72 = *pfVar1;
  fVar45 = pfVar1[1];
  fVar46 = pfVar1[2];
  pfVar2 = (float *)(pcVar7 + (uVar108 + 1) * sVar8);
  fVar71 = *pfVar2;
  fVar76 = pfVar2[1];
  fVar77 = pfVar2[2];
  pfVar3 = (float *)(pcVar7 + (uVar108 + 2) * sVar8);
  fVar80 = *pfVar3;
  fVar81 = pfVar3[1];
  fVar96 = pfVar3[2];
  pfVar4 = (float *)(pcVar7 + (uVar108 + 3) * sVar8);
  fVar62 = *pfVar4;
  fVar82 = pfVar4[1];
  fVar83 = pfVar4[2];
  fVar84 = (space->vx).field_0.m128[0];
  fVar85 = (space->vx).field_0.m128[1];
  fVar14 = (space->vx).field_0.m128[2];
  fVar15 = (space->vy).field_0.m128[0];
  fVar16 = (space->vy).field_0.m128[1];
  fVar17 = (space->vy).field_0.m128[2];
  fVar18 = (space->vz).field_0.m128[0];
  fVar19 = (space->vz).field_0.m128[1];
  fVar20 = (space->vz).field_0.m128[2];
  fVar34 = fVar72 * fVar84 + fVar45 * fVar15 + fVar46 * fVar18;
  fVar44 = fVar72 * fVar85 + fVar45 * fVar16 + fVar46 * fVar19;
  fVar45 = fVar72 * fVar14 + fVar45 * fVar17 + fVar46 * fVar20;
  fVar72 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar46 = pfVar1[3] * fVar72;
  fVar63 = fVar71 * fVar84 + fVar76 * fVar15 + fVar77 * fVar18;
  fVar70 = fVar71 * fVar85 + fVar76 * fVar16 + fVar77 * fVar19;
  fVar71 = fVar71 * fVar14 + fVar76 * fVar17 + fVar77 * fVar20;
  fVar76 = pfVar2[3] * fVar72;
  fVar90 = fVar80 * fVar84 + fVar81 * fVar15 + fVar96 * fVar18;
  fVar94 = fVar80 * fVar85 + fVar81 * fVar16 + fVar96 * fVar19;
  fVar96 = fVar80 * fVar14 + fVar81 * fVar17 + fVar96 * fVar20;
  fVar99 = pfVar3[3] * fVar72;
  fVar77 = fVar62 * fVar84 + fVar82 * fVar15 + fVar83 * fVar18;
  fVar80 = fVar62 * fVar85 + fVar82 * fVar16 + fVar83 * fVar19;
  fVar81 = fVar62 * fVar14 + fVar82 * fVar17 + fVar83 * fVar20;
  fVar72 = pfVar4[3] * fVar72;
  iVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          tessellationRate;
  lVar30 = (long)iVar5;
  if (lVar30 == 4) {
    auVar78._0_4_ =
         fVar34 * (float)bspline_basis0._272_4_ +
         fVar63 * (float)bspline_basis0._1428_4_ +
         fVar90 * (float)bspline_basis0._2584_4_ + fVar77 * (float)bspline_basis0._3740_4_;
    auVar78._4_4_ =
         fVar34 * (float)bspline_basis0._276_4_ +
         fVar63 * (float)bspline_basis0._1432_4_ +
         fVar90 * (float)bspline_basis0._2588_4_ + fVar77 * (float)bspline_basis0._3744_4_;
    auVar78._8_4_ =
         fVar34 * (float)bspline_basis0._280_4_ +
         fVar63 * (float)bspline_basis0._1436_4_ +
         fVar90 * (float)bspline_basis0._2592_4_ + fVar77 * (float)bspline_basis0._3748_4_;
    auVar78._12_4_ =
         fVar34 * (float)bspline_basis0._284_4_ +
         fVar63 * (float)bspline_basis0._1440_4_ +
         fVar90 * (float)bspline_basis0._2596_4_ + fVar77 * (float)bspline_basis0._3752_4_;
    fVar82 = fVar44 * (float)bspline_basis0._272_4_ +
             fVar70 * (float)bspline_basis0._1428_4_ +
             fVar94 * (float)bspline_basis0._2584_4_ + fVar80 * (float)bspline_basis0._3740_4_;
    fVar83 = fVar44 * (float)bspline_basis0._276_4_ +
             fVar70 * (float)bspline_basis0._1432_4_ +
             fVar94 * (float)bspline_basis0._2588_4_ + fVar80 * (float)bspline_basis0._3744_4_;
    fVar84 = fVar44 * (float)bspline_basis0._280_4_ +
             fVar70 * (float)bspline_basis0._1436_4_ +
             fVar94 * (float)bspline_basis0._2592_4_ + fVar80 * (float)bspline_basis0._3748_4_;
    fVar85 = fVar44 * (float)bspline_basis0._284_4_ +
             fVar70 * (float)bspline_basis0._1440_4_ +
             fVar94 * (float)bspline_basis0._2596_4_ + fVar80 * (float)bspline_basis0._3752_4_;
    auVar36._0_4_ =
         fVar45 * (float)bspline_basis0._272_4_ +
         fVar71 * (float)bspline_basis0._1428_4_ +
         fVar96 * (float)bspline_basis0._2584_4_ + fVar81 * (float)bspline_basis0._3740_4_;
    auVar36._4_4_ =
         fVar45 * (float)bspline_basis0._276_4_ +
         fVar71 * (float)bspline_basis0._1432_4_ +
         fVar96 * (float)bspline_basis0._2588_4_ + fVar81 * (float)bspline_basis0._3744_4_;
    auVar36._8_4_ =
         fVar45 * (float)bspline_basis0._280_4_ +
         fVar71 * (float)bspline_basis0._1436_4_ +
         fVar96 * (float)bspline_basis0._2592_4_ + fVar81 * (float)bspline_basis0._3748_4_;
    auVar36._12_4_ =
         fVar45 * (float)bspline_basis0._284_4_ +
         fVar71 * (float)bspline_basis0._1440_4_ +
         fVar96 * (float)bspline_basis0._2596_4_ + fVar81 * (float)bspline_basis0._3752_4_;
    fVar45 = fVar46 * (float)bspline_basis0._272_4_ +
             fVar76 * (float)bspline_basis0._1428_4_ +
             fVar99 * (float)bspline_basis0._2584_4_ + fVar72 * (float)bspline_basis0._3740_4_;
    fVar62 = fVar46 * (float)bspline_basis0._276_4_ +
             fVar76 * (float)bspline_basis0._1432_4_ +
             fVar99 * (float)bspline_basis0._2588_4_ + fVar72 * (float)bspline_basis0._3744_4_;
    auVar73._0_8_ = CONCAT44(auVar78._0_4_,auVar78._4_4_);
    auVar73._8_4_ = auVar78._12_4_;
    auVar73._12_4_ = auVar78._8_4_;
    auVar64._8_4_ = auVar78._12_4_;
    auVar64._0_8_ = auVar73._0_8_;
    auVar64._12_4_ = auVar78._8_4_;
    auVar65 = minps(auVar64,auVar78);
    auVar86._0_8_ = auVar65._8_8_;
    auVar86._8_4_ = auVar65._0_4_;
    auVar86._12_4_ = auVar65._4_4_;
    auVar87 = minps(auVar86,auVar65);
    auVar89._0_8_ = CONCAT44(fVar82,fVar83);
    auVar89._8_4_ = fVar85;
    auVar89._12_4_ = fVar84;
    auVar100._8_4_ = fVar85;
    auVar100._0_8_ = auVar89._0_8_;
    auVar100._12_4_ = fVar84;
    auVar11._4_4_ = fVar83;
    auVar11._0_4_ = fVar82;
    auVar11._8_4_ = fVar84;
    auVar11._12_4_ = fVar85;
    auVar65 = minps(auVar100,auVar11);
    auVar66._0_8_ = auVar65._8_8_;
    auVar66._8_4_ = auVar65._0_4_;
    auVar66._12_4_ = auVar65._4_4_;
    auVar65 = minps(auVar66,auVar65);
    auVar88._0_8_ = CONCAT44(auVar36._0_4_,auVar36._4_4_);
    auVar88._8_4_ = auVar36._12_4_;
    auVar88._12_4_ = auVar36._8_4_;
    auVar101._8_4_ = auVar36._12_4_;
    auVar101._0_8_ = auVar88._0_8_;
    auVar101._12_4_ = auVar36._8_4_;
    auVar102 = minps(auVar101,auVar36);
    auVar104._0_8_ = auVar102._8_8_;
    auVar104._8_4_ = auVar102._0_4_;
    auVar104._12_4_ = auVar102._4_4_;
    auVar102 = minps(auVar104,auVar102);
    auVar67._4_4_ = auVar65._0_4_;
    auVar67._0_4_ = auVar87._0_4_;
    auVar67._8_4_ = auVar102._0_4_;
    auVar67._12_4_ = 0;
    auVar65 = maxps(auVar73,auVar78);
    auVar79._0_8_ = auVar65._8_8_;
    auVar79._8_4_ = auVar65._0_4_;
    auVar79._12_4_ = auVar65._4_4_;
    auVar102 = maxps(auVar79,auVar65);
    auVar12._4_4_ = fVar83;
    auVar12._0_4_ = fVar82;
    auVar12._8_4_ = fVar84;
    auVar12._12_4_ = fVar85;
    auVar65 = maxps(auVar89,auVar12);
    auVar74._0_8_ = auVar65._8_8_;
    auVar74._8_4_ = auVar65._0_4_;
    auVar74._12_4_ = auVar65._4_4_;
    auVar87 = maxps(auVar74,auVar65);
    auVar65 = maxps(auVar88,auVar36);
    auVar37._0_8_ = auVar65._8_8_;
    auVar37._8_4_ = auVar65._0_4_;
    auVar37._12_4_ = auVar65._4_4_;
    auVar65 = maxps(auVar37,auVar65);
    auVar75._4_4_ = auVar87._0_4_;
    auVar75._0_4_ = auVar102._0_4_;
    auVar75._8_4_ = auVar65._0_4_;
    auVar75._12_4_ = 0;
    auVar56._0_8_ = CONCAT44(fVar62,fVar45) & 0x7fffffff7fffffff;
    auVar56._8_4_ =
         ABS(fVar46 * (float)bspline_basis0._280_4_ +
             fVar76 * (float)bspline_basis0._1436_4_ +
             fVar99 * (float)bspline_basis0._2592_4_ + fVar72 * (float)bspline_basis0._3748_4_);
    auVar56._12_4_ =
         ABS(fVar46 * (float)bspline_basis0._284_4_ +
             fVar76 * (float)bspline_basis0._1440_4_ +
             fVar99 * (float)bspline_basis0._2596_4_ + fVar72 * (float)bspline_basis0._3752_4_);
    auVar38._0_8_ = CONCAT44(fVar45,fVar62) & 0x7fffffff7fffffff;
    auVar38._8_4_ = auVar56._12_4_;
    auVar38._12_4_ = auVar56._8_4_;
    auVar65 = maxps(auVar38,auVar56);
    uVar35 = auVar65._0_4_;
    auVar39._8_4_ = auVar65._8_4_;
    auVar57._4_4_ = uVar35;
    auVar57._0_4_ = uVar35;
    auVar57._8_4_ = uVar35;
    auVar57._12_4_ = uVar35;
    auVar39._4_4_ = auVar39._8_4_;
    auVar39._0_4_ = auVar39._8_4_;
    auVar39._12_4_ = auVar39._8_4_;
    auVar65 = maxps(auVar39,auVar57);
    auVar47._0_4_ = fVar63 * 0.16666667 + fVar90 * 0.6666667 + fVar77 * 0.16666667;
    auVar47._4_4_ = fVar70 * 0.16666667 + fVar94 * 0.6666667 + fVar80 * 0.16666667;
    auVar47._8_4_ = fVar71 * 0.16666667 + fVar96 * 0.6666667 + fVar81 * 0.16666667;
    auVar47._12_4_ = fVar76 * 0.16666667 + fVar99 * 0.6666667 + fVar72 * 0.16666667;
    auVar87 = minps(auVar67,auVar47);
    auVar102 = maxps(auVar75,auVar47);
    uVar29 = CONCAT44(auVar47._12_4_,auVar47._12_4_);
    auVar48._0_8_ = uVar29 & 0x7fffffff7fffffff;
    auVar48._8_4_ = ABS(auVar47._12_4_);
    auVar48._12_4_ = ABS(auVar47._12_4_);
    auVar65 = maxps(auVar65,auVar48);
    fVar76 = auVar87._0_4_ - auVar65._0_4_;
    fVar77 = auVar87._4_4_ - auVar65._4_4_;
    fVar80 = auVar87._8_4_ - auVar65._8_4_;
    fVar81 = auVar87._12_4_ - auVar65._12_4_;
    fVar72 = auVar65._0_4_ + auVar102._0_4_;
    fVar45 = auVar65._4_4_ + auVar102._4_4_;
    fVar46 = auVar65._8_4_ + auVar102._8_4_;
    fVar71 = auVar65._12_4_ + auVar102._12_4_;
  }
  else {
    lVar31 = lVar30 * 0x44;
    auVar102 = ZEXT816(0);
    lVar33 = 0;
    local_e8 = _DAT_01f45a40;
    local_118 = 0x7f800000;
    uStack_114 = 0x7f800000;
    uStack_110 = 0x7f800000;
    uStack_10c = 0x7f800000;
    local_108._8_8_ = 0x7f8000007f800000;
    local_108._0_8_ = 0x7f8000007f800000;
    local_f8 = 0x7f800000;
    uStack_f4 = 0x7f800000;
    uStack_f0 = 0x7f800000;
    uStack_ec = 0x7f800000;
    auVar65 = _DAT_01f45a40;
    auVar87 = _DAT_01f45a40;
    while( true ) {
      uVar108 = local_e8._0_4_;
      uVar111 = local_e8._8_4_;
      uVar112 = local_e8._12_4_;
      if (lVar30 < lVar33) break;
      uVar32 = (uint)lVar33;
      auVar103._0_4_ = -(uint)(iVar5 < (int)uVar32);
      auVar103._4_4_ = -(uint)(iVar5 < (int)(uVar32 | 1));
      auVar103._8_4_ = -(uint)(iVar5 < (int)(uVar32 | 2));
      auVar103._12_4_ = -(uint)(iVar5 < (int)(uVar32 | 3));
      pfVar1 = (float *)(lVar31 + 0x2200430 + lVar33 * 4);
      fVar62 = *pfVar1;
      fVar82 = pfVar1[1];
      fVar83 = pfVar1[2];
      fVar84 = pfVar1[3];
      pfVar1 = (float *)(lVar31 + 0x22008b4 + lVar33 * 4);
      fVar85 = *pfVar1;
      fVar14 = pfVar1[1];
      fVar15 = pfVar1[2];
      fVar16 = pfVar1[3];
      pfVar1 = (float *)(lVar31 + 0x21fffac + lVar33 * 4);
      fVar17 = *pfVar1;
      fVar18 = pfVar1[1];
      fVar19 = pfVar1[2];
      fVar20 = pfVar1[3];
      pfVar1 = (float *)(bspline_basis0 + lVar33 * 4 + lVar31);
      fVar21 = *pfVar1;
      fVar22 = pfVar1[1];
      fVar23 = pfVar1[2];
      fVar24 = pfVar1[3];
      fVar113 = fVar34 * fVar21 + fVar63 * fVar17 + fVar90 * fVar62 + fVar77 * fVar85;
      fVar114 = fVar34 * fVar22 + fVar63 * fVar18 + fVar90 * fVar82 + fVar77 * fVar14;
      fVar115 = fVar34 * fVar23 + fVar63 * fVar19 + fVar90 * fVar83 + fVar77 * fVar15;
      fVar116 = fVar34 * fVar24 + fVar63 * fVar20 + fVar90 * fVar84 + fVar77 * fVar16;
      fVar91 = fVar44 * fVar21 + fVar70 * fVar17 + fVar94 * fVar62 + fVar80 * fVar85;
      fVar95 = fVar44 * fVar22 + fVar70 * fVar18 + fVar94 * fVar82 + fVar80 * fVar14;
      fVar97 = fVar44 * fVar23 + fVar70 * fVar19 + fVar94 * fVar83 + fVar80 * fVar15;
      fVar98 = fVar44 * fVar24 + fVar70 * fVar20 + fVar94 * fVar84 + fVar80 * fVar16;
      auVar105._0_4_ = fVar45 * fVar21 + fVar71 * fVar17 + fVar96 * fVar62 + fVar81 * fVar85;
      auVar105._4_4_ = fVar45 * fVar22 + fVar71 * fVar18 + fVar96 * fVar82 + fVar81 * fVar14;
      auVar105._8_4_ = fVar45 * fVar23 + fVar71 * fVar19 + fVar96 * fVar83 + fVar81 * fVar15;
      auVar105._12_4_ = fVar45 * fVar24 + fVar71 * fVar20 + fVar96 * fVar84 + fVar81 * fVar16;
      auVar9._4_4_ = fVar114;
      auVar9._0_4_ = fVar113;
      auVar9._8_4_ = fVar115;
      auVar9._12_4_ = fVar116;
      auVar109 = minps(local_108,auVar9);
      auVar92._0_4_ = local_108._0_4_ & auVar103._0_4_;
      auVar92._4_4_ = local_108._4_4_ & auVar103._4_4_;
      auVar92._8_4_ = local_108._8_4_ & auVar103._8_4_;
      auVar92._12_4_ = local_108._12_4_ & auVar103._12_4_;
      local_108 = auVar92 | ~auVar103 & auVar109;
      auVar27._4_4_ = uStack_114;
      auVar27._0_4_ = local_118;
      auVar27._8_4_ = uStack_110;
      auVar27._12_4_ = uStack_10c;
      auVar25._4_4_ = fVar95;
      auVar25._0_4_ = fVar91;
      auVar25._8_4_ = fVar97;
      auVar25._12_4_ = fVar98;
      auVar109 = minps(auVar27,auVar25);
      local_118 = local_118 & auVar103._0_4_ | ~auVar103._0_4_ & auVar109._0_4_;
      uStack_114 = uStack_114 & auVar103._4_4_ | ~auVar103._4_4_ & auVar109._4_4_;
      uStack_110 = uStack_110 & auVar103._8_4_ | ~auVar103._8_4_ & auVar109._8_4_;
      uStack_10c = uStack_10c & auVar103._12_4_ | ~auVar103._12_4_ & auVar109._12_4_;
      auVar28._4_4_ = uStack_f4;
      auVar28._0_4_ = local_f8;
      auVar28._8_4_ = uStack_f0;
      auVar28._12_4_ = uStack_ec;
      auVar109 = minps(auVar28,auVar105);
      local_f8 = local_f8 & auVar103._0_4_ | ~auVar103._0_4_ & auVar109._0_4_;
      uStack_f4 = uStack_f4 & auVar103._4_4_ | ~auVar103._4_4_ & auVar109._4_4_;
      uStack_f0 = uStack_f0 & auVar103._8_4_ | ~auVar103._8_4_ & auVar109._8_4_;
      uStack_ec = uStack_ec & auVar103._12_4_ | ~auVar103._12_4_ & auVar109._12_4_;
      auVar10._4_4_ = fVar114;
      auVar10._0_4_ = fVar113;
      auVar10._8_4_ = fVar115;
      auVar10._12_4_ = fVar116;
      auVar109 = maxps(local_e8,auVar10);
      local_e8._4_4_ = local_e8._4_4_ & auVar103._4_4_ | ~auVar103._4_4_ & auVar109._4_4_;
      local_e8._0_4_ = uVar108 & auVar103._0_4_ | ~auVar103._0_4_ & auVar109._0_4_;
      local_e8._8_4_ = uVar111 & auVar103._8_4_ | ~auVar103._8_4_ & auVar109._8_4_;
      local_e8._12_4_ = uVar112 & auVar103._12_4_ | ~auVar103._12_4_ & auVar109._12_4_;
      auVar26._4_4_ = fVar95;
      auVar26._0_4_ = fVar91;
      auVar26._8_4_ = fVar97;
      auVar26._12_4_ = fVar98;
      auVar109 = maxps(auVar87,auVar26);
      auVar93._0_4_ = ~auVar103._0_4_ & auVar109._0_4_;
      auVar93._4_4_ = ~auVar103._4_4_ & auVar109._4_4_;
      auVar93._8_4_ = ~auVar103._8_4_ & auVar109._8_4_;
      auVar93._12_4_ = ~auVar103._12_4_ & auVar109._12_4_;
      auVar117._0_4_ = auVar87._0_4_ & auVar103._0_4_;
      auVar117._4_4_ = auVar87._4_4_ & auVar103._4_4_;
      auVar117._8_4_ = auVar87._8_4_ & auVar103._8_4_;
      auVar117._12_4_ = auVar87._12_4_ & auVar103._12_4_;
      auVar87 = auVar117 | auVar93;
      auVar109 = maxps(auVar65,auVar105);
      auVar106._0_4_ = ~auVar103._0_4_ & auVar109._0_4_;
      auVar106._4_4_ = ~auVar103._4_4_ & auVar109._4_4_;
      auVar106._8_4_ = ~auVar103._8_4_ & auVar109._8_4_;
      auVar106._12_4_ = ~auVar103._12_4_ & auVar109._12_4_;
      auVar110._0_4_ = auVar65._0_4_ & auVar103._0_4_;
      auVar110._4_4_ = auVar65._4_4_ & auVar103._4_4_;
      auVar110._8_4_ = auVar65._8_4_ & auVar103._8_4_;
      auVar110._12_4_ = auVar65._12_4_ & auVar103._12_4_;
      auVar65 = auVar110 | auVar106;
      auVar13._8_4_ = ABS(fVar23 * fVar46 + fVar19 * fVar76 + fVar83 * fVar99 + fVar15 * fVar72);
      auVar13._0_8_ =
           CONCAT44(fVar22 * fVar46 + fVar18 * fVar76 + fVar82 * fVar99 + fVar14 * fVar72,
                    fVar21 * fVar46 + fVar17 * fVar76 + fVar62 * fVar99 + fVar85 * fVar72) &
           0x7fffffff7fffffff;
      auVar13._12_4_ = ABS(fVar24 * fVar46 + fVar20 * fVar76 + fVar84 * fVar99 + fVar16 * fVar72);
      auVar109 = maxps(auVar102,auVar13);
      auVar107._0_4_ = auVar102._0_4_ & auVar103._0_4_;
      auVar107._4_4_ = auVar102._4_4_ & auVar103._4_4_;
      auVar107._8_4_ = auVar102._8_4_ & auVar103._8_4_;
      auVar107._12_4_ = auVar102._12_4_ & auVar103._12_4_;
      auVar102._0_4_ = ~auVar103._0_4_ & auVar109._0_4_;
      auVar102._4_4_ = ~auVar103._4_4_ & auVar109._4_4_;
      auVar102._8_4_ = ~auVar103._8_4_ & auVar109._8_4_;
      auVar102._12_4_ = ~auVar103._12_4_ & auVar109._12_4_;
      auVar102 = auVar107 | auVar102;
      lVar33 = lVar33 + 4;
    }
    auVar50._4_4_ = local_108._0_4_;
    auVar50._0_4_ = local_108._4_4_;
    auVar50._8_4_ = local_108._12_4_;
    auVar50._12_4_ = local_108._8_4_;
    auVar109 = minps(auVar50,local_108);
    auVar69._0_8_ = auVar109._8_8_;
    auVar69._8_4_ = auVar109._0_4_;
    auVar69._12_4_ = auVar109._4_4_;
    auVar50 = minps(auVar69,auVar109);
    auVar109._4_4_ = uStack_114;
    auVar109._0_4_ = local_118;
    auVar109._8_4_ = uStack_110;
    auVar109._12_4_ = uStack_10c;
    auVar61._4_4_ = local_118;
    auVar61._0_4_ = uStack_114;
    auVar61._8_4_ = uStack_10c;
    auVar61._12_4_ = uStack_110;
    auVar109 = minps(auVar61,auVar109);
    auVar68._0_8_ = auVar109._8_8_;
    auVar68._8_4_ = auVar109._0_4_;
    auVar68._12_4_ = auVar109._4_4_;
    auVar69 = minps(auVar68,auVar109);
    auVar52._4_4_ = uStack_f4;
    auVar52._0_4_ = local_f8;
    auVar52._8_4_ = uStack_f0;
    auVar52._12_4_ = uStack_ec;
    auVar40._4_4_ = local_f8;
    auVar40._0_4_ = uStack_f4;
    auVar40._8_4_ = uStack_ec;
    auVar40._12_4_ = uStack_f0;
    auVar109 = minps(auVar40,auVar52);
    auVar51._0_8_ = auVar109._8_8_;
    auVar51._8_4_ = auVar109._0_4_;
    auVar51._12_4_ = auVar109._4_4_;
    auVar52 = minps(auVar51,auVar109);
    auVar41._4_4_ = uVar108;
    auVar41._0_4_ = local_e8._4_4_;
    auVar41._8_4_ = uVar112;
    auVar41._12_4_ = uVar111;
    auVar109 = maxps(auVar41,local_e8);
    auVar53._0_8_ = auVar109._8_8_;
    auVar53._8_4_ = auVar109._0_4_;
    auVar53._12_4_ = auVar109._4_4_;
    auVar109 = maxps(auVar53,auVar109);
    auVar42._4_4_ = auVar87._0_4_;
    auVar42._0_4_ = auVar87._4_4_;
    auVar42._8_4_ = auVar87._12_4_;
    auVar42._12_4_ = auVar87._8_4_;
    auVar87 = maxps(auVar42,auVar87);
    auVar60._0_8_ = auVar87._8_8_;
    auVar60._8_4_ = auVar87._0_4_;
    auVar60._12_4_ = auVar87._4_4_;
    auVar61 = maxps(auVar60,auVar87);
    auVar87._4_4_ = auVar65._0_4_;
    auVar87._0_4_ = auVar65._4_4_;
    auVar87._8_4_ = auVar65._12_4_;
    auVar87._12_4_ = auVar65._8_4_;
    auVar65 = maxps(auVar87,auVar65);
    auVar54._0_8_ = auVar65._8_8_;
    auVar54._8_4_ = auVar65._0_4_;
    auVar54._12_4_ = auVar65._4_4_;
    auVar87 = maxps(auVar54,auVar65);
    auVar65._4_4_ = auVar102._0_4_;
    auVar65._0_4_ = auVar102._4_4_;
    auVar65._8_4_ = auVar102._12_4_;
    auVar65._12_4_ = auVar102._8_4_;
    auVar65 = maxps(auVar65,auVar102);
    uVar35 = auVar65._0_4_;
    auVar43._8_4_ = auVar65._8_4_;
    auVar55._4_4_ = uVar35;
    auVar55._0_4_ = uVar35;
    auVar55._8_4_ = uVar35;
    auVar55._12_4_ = uVar35;
    auVar43._4_4_ = auVar43._8_4_;
    auVar43._0_4_ = auVar43._8_4_;
    auVar43._12_4_ = auVar43._8_4_;
    auVar65 = maxps(auVar43,auVar55);
    fVar76 = auVar50._0_4_ - auVar65._0_4_;
    fVar77 = auVar69._0_4_ - auVar65._4_4_;
    fVar80 = auVar52._0_4_ - auVar65._8_4_;
    fVar81 = 0.0 - auVar65._12_4_;
    fVar72 = auVar65._0_4_ + auVar109._0_4_;
    fVar45 = auVar65._4_4_ + auVar61._0_4_;
    fVar46 = auVar65._8_4_ + auVar87._0_4_;
    fVar71 = auVar65._12_4_ + 0.0;
  }
  auVar58._0_8_ = CONCAT44(fVar77,fVar76) & 0x7fffffff7fffffff;
  auVar58._8_4_ = ABS(fVar80);
  auVar58._12_4_ = ABS(fVar81);
  auVar49._0_8_ = CONCAT44(fVar45,fVar72) & 0x7fffffff7fffffff;
  auVar49._8_4_ = ABS(fVar46);
  auVar49._12_4_ = ABS(fVar71);
  auVar65 = maxps(auVar58,auVar49);
  fVar96 = auVar65._4_4_;
  if (auVar65._4_4_ <= auVar65._0_4_) {
    fVar96 = auVar65._0_4_;
  }
  auVar59._8_8_ = auVar65._8_8_;
  auVar59._0_8_ = auVar65._8_8_;
  if (auVar65._8_4_ <= fVar96) {
    auVar59._0_4_ = fVar96;
  }
  fVar96 = auVar59._0_4_ * 4.7683716e-07;
  (__return_storage_ptr__->lower).field_0.m128[0] = fVar76 - fVar96;
  (__return_storage_ptr__->lower).field_0.m128[1] = fVar77 - fVar96;
  (__return_storage_ptr__->lower).field_0.m128[2] = fVar80 - fVar96;
  (__return_storage_ptr__->lower).field_0.m128[3] = fVar81 - fVar96;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar96 + fVar72;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar96 + fVar45;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar96 + fVar46;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar96 + fVar71;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }